

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inequation.cpp
# Opt level: O3

void __thiscall inequation_True1_Test::TestBody(inequation_True1_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> ex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _func_int **message;
  ExprPtr EVar1;
  ExprPtr e;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  AssertHelper local_40;
  undefined1 local_38 [16];
  undefined1 local_28 [32];
  
  mathiu::impl::operator____s(local_38,0x21facb);
  mathiu::impl::operator____s(local_50,0x21facb);
  EVar1 = mathiu::impl::operator==
                    ((impl *)(local_28 + 0x10),(ExprPtr *)local_38,(ExprPtr *)local_50);
  ex = EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
    ex._M_pi = extraout_RDX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
    ex._M_pi = extraout_RDX_00;
  }
  mathiu::impl::toString_abi_cxx11_
            ((string *)local_38,(impl *)(local_28 + 0x10),(ExprPtr *)ex._M_pi);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_50,"toString(e)","\"true\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (char (*) [5])"true");
  if ((element_type *)local_38._0_8_ != (element_type *)local_28) {
    operator_delete((void *)local_38._0_8_,local_28._0_8_ + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_38);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int **)0x21d6c4;
    }
    else {
      message = (_func_int **)((_Alloc_hider *)&(local_48._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/inequation.cpp"
               ,0x15,(char *)message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((element_type *)local_38._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_38._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_pi
                );
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_);
  }
  return;
}

Assistant:

TEST(inequation, True1)
{
    auto const e = "x"_s == "x"_s;
    EXPECT_EQ(toString(e), "true");
}